

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O3

bool djgp_push_file(djg_program *program,char *file)

{
  size_t sVar1;
  FILE *__stream;
  size_t sVar2;
  char *__ptr;
  djg_program *pdVar3;
  djg_program *pdVar4;
  size_t sVar5;
  char letter;
  undefined1 local_21;
  
  if (program != (djg_program *)0x0) {
    __stream = fopen(file,"r");
    if (__stream == (FILE *)0x0) {
      fwrite("djg_error: Function fopen() failed\n",0x23,1,_stdout);
      fflush(_stdout);
    }
    else {
      sVar1 = 0;
      do {
        sVar5 = sVar1;
        sVar2 = fread(&local_21,1,1,__stream);
        sVar1 = sVar5 + 1;
      } while (sVar2 != 0);
      rewind(__stream);
      __ptr = (char *)malloc(sVar5 + 2);
      fread(__ptr,1,sVar5 + 1,__stream);
      fclose(__stream);
      (__ptr + sVar5)[0] = '\n';
      (__ptr + sVar5)[1] = '\0';
      djgp_push_string(program,"#line 1\n");
      do {
        pdVar4 = program;
        program = pdVar4->next;
      } while (program != (djg_program *)0x0);
      pdVar3 = (djg_program *)calloc(1,0x10);
      pdVar4->next = pdVar3;
      pdVar3->src = __ptr;
    }
    return __stream != (FILE *)0x0;
  }
  __assert_fail("program",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_opengl/dj_opengl.h"
                ,0x1ba,"bool djgp_push_file(djg_program *, const char *)");
}

Assistant:

DJGDEF bool djgp_push_file(djg_program *program, const char *file)
{
    FILE *pf;
    char *src, letter;
    int n = 0;

    DJG_ASSERT(program);
    pf = fopen(file, "r");
    if (!pf) {
        DJG_LOG("djg_error: Function fopen() failed\n");
        return false;
    }

    // get file length
#if 0 // nonportable (does not work with vs2010)
    fseek(pf, 0, SEEK_END);
    n = (int)ftell(pf) + /* '\0' */1;
#else
    do {++n;} while (fread(&letter, 1, 1, pf));
    ++n; // add an extra char for an endline
#endif
    rewind(pf);

    // read and push to source
    src = (char *)DJG_MALLOC(sizeof(char) * n);
    fread(src, 1, n-1, pf);
    fclose(pf);
    src[n-2] = '\n'; // add endline
    src[n-1] = '\0'; // add EOF

    // add a line parameter (easier for debugging)
    djgp_push_string(program, "#line 1\n");

    return djgp__push_src(program, src);
}